

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O1

void __thiscall
MemPlumberInternal::freeMemory(MemPlumberInternal *this,void *pointer,char *file,int line)

{
  undefined8 *puVar1;
  ulong uVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *__ptr;
  
  if (pointer != (void *)0x0) {
    uVar2 = (ulong)((uint)((ulong)pointer >> 5) & 0x1fff8);
    __ptr = *(undefined8 **)((long)this->m_PointerListHashtable + uVar2);
    puVar4 = (undefined8 *)0x0;
    do {
      if (__ptr == (undefined8 *)0x0) {
        if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
          fprintf((FILE *)this->m_Dumper,"Pointer 0x%p wasn\'t found\n",pointer);
        }
        free(pointer);
        return;
      }
      puVar1 = __ptr + 0xf;
      if (puVar1 == (undefined8 *)pointer) {
        puVar3 = puVar4;
        if (puVar4 == (undefined8 *)0x0) {
          puVar3 = (undefined8 *)((long)this->m_PointerListHashtable + uVar2);
        }
        *puVar3 = *__ptr;
        if (((FILE *)this->m_Dumper != (FILE *)0x0 & this->m_Verbose) == 1) {
          fprintf((FILE *)this->m_Dumper,"Free: 0x%p (size %d[bytes]) allocated in: %s:%d\n",pointer
                  ,(ulong)*(uint *)(__ptr + 0xe),__ptr + 1,(ulong)*(uint *)((long)__ptr + 0x6c));
        }
        free(__ptr);
      }
      else {
        puVar4 = __ptr;
        __ptr = (undefined8 *)*__ptr;
      }
    } while (puVar1 != (undefined8 *)pointer);
  }
  return;
}

Assistant:

void freeMemory(void* pointer, const char* file, int line) {

        if (pointer == NULL) {
            return;
        }

        // find the metadata record bucket in the hash table
        size_t hashIndex = MEMPLUMBER_HASH(pointer);
        new_ptr_list_t* metaDataBucketLinkedListElement = m_PointerListHashtable[hashIndex];
	    new_ptr_list_t* metaDataBucketLinkedListPrevElement = NULL;

        // inside the bucket, go over the linked list until you find the specific pointer
        while (metaDataBucketLinkedListElement != NULL) {

            // get the actual pointer from the record
            void* actualPointerInRecord = (char*)metaDataBucketLinkedListElement + sizeof(new_ptr_list_t);

            // if this is not the pointer we're looking for - continue the search
            if (actualPointerInRecord != pointer) {
                metaDataBucketLinkedListPrevElement = metaDataBucketLinkedListElement;
                metaDataBucketLinkedListElement = metaDataBucketLinkedListElement->next;
                continue;
            }
            else { // this is the pointer we're looking for

                // remove the current element from the linked list
                if (metaDataBucketLinkedListPrevElement == NULL) { // this is the first item in the list
                    m_PointerListHashtable[hashIndex] = metaDataBucketLinkedListElement->next;
                }
                else { // this is not the first item in the list
                    metaDataBucketLinkedListPrevElement->next = metaDataBucketLinkedListElement->next;
                }

                if (isVerbose()) {
                    fprintf(m_Dumper, "Free: 0x%p (size %d[bytes]) allocated in: %s:%d\n", 
                        pointer,
                        (int)metaDataBucketLinkedListElement->size,
                        metaDataBucketLinkedListElement->file, 
                        metaDataBucketLinkedListElement->line);
                }

                // free the memory of the current item
                free(metaDataBucketLinkedListElement);

                return;
            }
        }

        // if got to here it means memory was allocated before monitoring started. Simply free the memory and return 
        if (isVerbose()) {
            fprintf(m_Dumper, "Pointer 0x%p wasn't found\n", pointer);
        }

        free(pointer);
    }